

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_data_source_read_pcm_frames_from_backend
                    (ma_data_source *pDataSource,void *pFramesOut,ma_uint64 frameCount,
                    ma_uint64 *pFramesRead)

{
  ma_result mVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ma_data_source_base *pDataSourceBase;
  ma_uint32 channels;
  ma_uint32 sampleRate;
  ma_uint8 pDiscardBuffer [4096];
  long local_1050;
  ma_uint64 *local_1048;
  undefined1 local_103c [4];
  uint local_1038 [1026];
  
  if (pFramesOut != (void *)0x0) {
    mVar1 = (*(code *)**pDataSource)(pDataSource,pFramesOut,frameCount);
    return mVar1;
  }
  local_1048 = pFramesRead;
  if (pDataSource == (ma_data_source *)0x0) {
    mVar1 = MA_INVALID_ARGS;
  }
  else {
    if (*(code **)(*pDataSource + 0x10) != (code *)0x0) {
      uVar5 = 0;
      mVar1 = (**(code **)(*pDataSource + 0x10))(pDataSource,local_1038,&local_1050,local_103c,0,0);
      iVar2 = 0;
      if (mVar1 == MA_SUCCESS) {
        uVar5 = (ulong)local_1038[0];
        mVar1 = MA_SUCCESS;
        iVar2 = (int)local_1050;
      }
      goto LAB_00183d5a;
    }
    mVar1 = MA_NOT_IMPLEMENTED;
  }
  uVar5 = 0;
  iVar2 = 0;
LAB_00183d5a:
  if (mVar1 == MA_SUCCESS) {
    uVar5 = 0x1000 / (ulong)(uint)(iVar2 * (&DAT_0019eb10)[uVar5]);
    uVar6 = 0;
    do {
      uVar4 = frameCount - uVar6;
      if (frameCount < uVar6 || uVar4 == 0) {
        *local_1048 = uVar6;
        return MA_SUCCESS;
      }
      local_1050 = 0;
      if (uVar5 <= uVar4) {
        uVar4 = uVar5;
      }
      mVar1 = (*(code *)**pDataSource)(pDataSource,local_1038,uVar4,&local_1050);
      lVar3 = 0;
      if (mVar1 == MA_SUCCESS) {
        lVar3 = local_1050;
      }
      uVar6 = uVar6 + lVar3;
    } while (mVar1 == MA_SUCCESS);
  }
  return mVar1;
}

Assistant:

static ma_result ma_data_source_read_pcm_frames_from_backend(ma_data_source* pDataSource, void* pFramesOut, ma_uint64 frameCount, ma_uint64* pFramesRead)
{
    ma_data_source_base* pDataSourceBase = (ma_data_source_base*)pDataSource;

    MA_ASSERT(pDataSourceBase                 != NULL);
    MA_ASSERT(pDataSourceBase->vtable         != NULL);
    MA_ASSERT(pDataSourceBase->vtable->onRead != NULL);
    MA_ASSERT(pFramesRead != NULL);

    if (pFramesOut != NULL) {
        return pDataSourceBase->vtable->onRead(pDataSourceBase, pFramesOut, frameCount, pFramesRead);
    } else {
        /*
        No output buffer. Probably seeking forward. Read and discard. Can probably optimize this in terms of
        onSeek and onGetCursor, but need to keep in mind that the data source may not implement these functions.
        */
        ma_result result;
        ma_uint64 framesRead;
        ma_format format;
        ma_uint32 channels;
        ma_uint64 discardBufferCapInFrames;
        ma_uint8  pDiscardBuffer[4096];

        result = ma_data_source_get_data_format(pDataSource, &format, &channels, NULL, NULL, 0);
        if (result != MA_SUCCESS) {
            return result;
        }

        discardBufferCapInFrames = sizeof(pDiscardBuffer) / ma_get_bytes_per_frame(format, channels);

        framesRead = 0;
        while (framesRead < frameCount) {
            ma_uint64 framesReadThisIteration = 0;
            ma_uint64 framesToRead = frameCount - framesRead;
            if (framesToRead > discardBufferCapInFrames) {
                framesToRead = discardBufferCapInFrames;
            }

            result = pDataSourceBase->vtable->onRead(pDataSourceBase, pDiscardBuffer, framesToRead, &framesReadThisIteration);
            if (result != MA_SUCCESS) {
                return result;
            }

            framesRead += framesReadThisIteration;
        }

        *pFramesRead = framesRead;

        return MA_SUCCESS;
    }
}